

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_schema.c
# Opt level: O2

void tnt_schema_sval_free(tnt_schema_sval *val)

{
  mh_assoc_t *h;
  tnt_schema_ival *val_00;
  uint uVar1;
  mh_int_t mVar2;
  void *extraout_RDX;
  void *pvVar3;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  assoc_val *ptr;
  assoc_val *ptr_00;
  mh_int_t i;
  uint uVar4;
  uint uVar5;
  undefined1 local_40 [8];
  assoc_key key_number;
  
  if (val != (tnt_schema_sval *)0x0) {
    tnt_mem_free(val->name);
    h = val->index;
    if (h != (mh_assoc_t *)0x0) {
      uVar1 = h->n_buckets;
      pvVar3 = extraout_RDX;
      for (uVar4 = 0;
          (uVar5 = uVar1, uVar1 != uVar4 &&
          (pvVar3 = (void *)(ulong)(uVar4 & 0xf), uVar5 = uVar4,
          (h->b[uVar4 >> 4] >> (uVar4 & 0xf) & 1) == 0)); uVar4 = uVar4 + 1) {
      }
LAB_0010618d:
      if (uVar5 < uVar1) {
        val_00 = (tnt_schema_ival *)h->p[uVar5]->data;
        local_40 = (undefined1  [8])&val_00->number;
        key_number.id._0_4_ = 4;
        mVar2 = mh_assoc_find(h,(assoc_key *)local_40,pvVar3);
        if (mVar2 == h->n_buckets) {
          ptr_00 = (assoc_val *)0x0;
          pvVar3 = extraout_RDX_00;
        }
        else {
          ptr_00 = h->p[(long)(ulong)mVar2];
          mh_assoc_del(h,mVar2,(void *)(ulong)mVar2);
          pvVar3 = extraout_RDX_01;
        }
        local_40 = (undefined1  [8])val_00->name;
        key_number.id._0_4_ = val_00->name_len;
        mVar2 = mh_assoc_find(h,(assoc_key *)local_40,pvVar3);
        if (mVar2 == h->n_buckets) {
          ptr = (assoc_val *)0x0;
        }
        else {
          ptr = h->p[(long)(ulong)mVar2];
          mh_assoc_del(h,mVar2,(void *)(ulong)mVar2);
        }
        tnt_schema_ival_free(val_00);
        pvVar3 = extraout_RDX_02;
        if (ptr_00 != (assoc_val *)0x0) {
          tnt_mem_free(ptr_00);
          pvVar3 = extraout_RDX_03;
        }
        if (ptr != (assoc_val *)0x0) {
          tnt_mem_free(ptr);
          pvVar3 = extraout_RDX_04;
        }
        uVar1 = h->n_buckets;
        uVar4 = uVar5;
        if (uVar5 < uVar1) {
          do {
            uVar4 = uVar4 + 1;
            uVar5 = uVar1;
            if (uVar1 <= uVar4) break;
            pvVar3 = (void *)(ulong)(uVar4 & 0xf);
            uVar5 = uVar4;
          } while ((h->b[uVar4 >> 4] >> (uVar4 & 0xf) & 1) == 0);
        }
        goto LAB_0010618d;
      }
      mh_assoc_delete(val->index);
    }
  }
  tnt_mem_free(val);
  return;
}

Assistant:

static inline void
tnt_schema_sval_free(struct tnt_schema_sval *val) {
	if (val) {
		tnt_mem_free(val->name);
		if (val->index) {
			tnt_schema_index_free(val->index);
			mh_assoc_delete(val->index);
		}
	}
	tnt_mem_free(val);
}